

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCore.cpp
# Opt level: O2

bool __thiscall helics::tcp::TcpCoreSS::brokerConnect(TcpCoreSS *this)

{
  bool bVar1;
  string_view flag;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&lock,
             &(this->super_NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>
              ).dataMutex);
  if ((this->connections).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->connections).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    TcpCommsSS::addConnections
              ((this->
               super_NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>).
               super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore>.comms._M_t.
               super___uniq_ptr_impl<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::tcp::TcpCommsSS_*,_std::default_delete<helics::tcp::TcpCommsSS>_>
               .super__Head_base<0UL,_helics::tcp::TcpCommsSS_*,_false>._M_head_impl,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&this->connections);
  }
  if (this->no_outgoing_connections == true) {
    flag._M_str = "allow_outgoing";
    flag._M_len = 0xe;
    TcpCommsSS::setFlag((this->
                        super_NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>
                        ).super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore>.comms._M_t.
                        super___uniq_ptr_impl<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::tcp::TcpCommsSS_*,_std::default_delete<helics::tcp::TcpCommsSS>_>
                        .super__Head_base<0UL,_helics::tcp::TcpCommsSS_*,_false>._M_head_impl,flag,
                        false);
  }
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&lock);
  bVar1 = NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>::brokerConnect
                    (&this->
                      super_NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>
                    );
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&lock);
  return bVar1;
}

Assistant:

bool TcpCoreSS::brokerConnect()
    {
        std::unique_lock<std::mutex> lock(dataMutex);
        if (!connections.empty()) {
            comms->addConnections(connections);
        }
        if (no_outgoing_connections) {
            comms->setFlag("allow_outgoing", false);
        }
        lock.unlock();
        return NetworkCore::brokerConnect();
    }